

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Postprocess.cpp
# Opt level: O3

void __thiscall
Assimp::AMFImporter::Postprocess_BuildNodeAndObject
          (AMFImporter *this,CAMFImporter_NodeElement_Object *pNodeElement,
          list<aiMesh_*,_std::allocator<aiMesh_*>_> *pMeshList,aiNode **pSceneNode)

{
  EType EVar1;
  ulong __n;
  CAMFImporter_NodeElement_Color *pNodeElement_00;
  aiNode *this_00;
  _List_node_base *p_Var2;
  CAMFImporter_NodeElement_Color *pCVar3;
  aiNode *this_01;
  CAMFImporter_NodeElement_Color *pObjectColor;
  vector<CAMFImporter_NodeElement_Color_*,_std::allocator<CAMFImporter_NodeElement_Color_*>_>
  color_arr;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> vertex_arr;
  vector<CAMFImporter_NodeElement_Color_*,_std::allocator<CAMFImporter_NodeElement_Color_*>_>
  local_88;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_68;
  aiNode **local_50;
  AMFImporter *local_48;
  list<aiMesh_*,_std::allocator<aiMesh_*>_> *local_40;
  _List_node_base *local_38;
  
  local_48 = this;
  local_40 = pMeshList;
  this_00 = (aiNode *)operator_new(0x478);
  this_01 = this_00;
  aiNode::aiNode(this_00);
  *pSceneNode = this_00;
  __n = (pNodeElement->super_CAMFImporter_NodeElement).ID._M_string_length;
  local_50 = pSceneNode;
  if (__n < 0x400) {
    (this_00->mName).length = (ai_uint32)__n;
    this_01 = (aiNode *)(this_00->mName).data;
    memcpy(this_01,(pNodeElement->super_CAMFImporter_NodeElement).ID._M_dataplus._M_p,__n);
    (this_00->mName).data[__n] = '\0';
  }
  p_Var2 = (pNodeElement->super_CAMFImporter_NodeElement).Child.
           super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  local_38 = (_List_node_base *)&(pNodeElement->super_CAMFImporter_NodeElement).Child;
  if (p_Var2 != local_38) {
    pObjectColor = (CAMFImporter_NodeElement_Color *)0x0;
    do {
      pNodeElement_00 = (CAMFImporter_NodeElement_Color *)p_Var2[1]._M_next;
      local_68.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_68.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.
      super__Vector_base<CAMFImporter_NodeElement_Color_*,_std::allocator<CAMFImporter_NodeElement_Color_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_88.
      super__Vector_base<CAMFImporter_NodeElement_Color_*,_std::allocator<CAMFImporter_NodeElement_Color_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.
      super__Vector_base<CAMFImporter_NodeElement_Color_*,_std::allocator<CAMFImporter_NodeElement_Color_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      EVar1 = (pNodeElement_00->super_CAMFImporter_NodeElement).Type;
      pCVar3 = pObjectColor;
      if (EVar1 == ENET_Color) {
        pCVar3 = pNodeElement_00;
      }
      if (EVar1 == ENET_Mesh) {
        PostprocessHelper_CreateMeshDataArray
                  ((AMFImporter *)this_01,(CAMFImporter_NodeElement_Mesh *)pNodeElement_00,&local_68
                   ,&local_88);
        Postprocess_BuildMeshSet
                  (local_48,(CAMFImporter_NodeElement_Mesh *)pNodeElement_00,&local_68,&local_88,
                   pObjectColor,local_40,*local_50);
        if (local_88.
            super__Vector_base<CAMFImporter_NodeElement_Color_*,_std::allocator<CAMFImporter_NodeElement_Color_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_88.
                          super__Vector_base<CAMFImporter_NodeElement_Color_*,_std::allocator<CAMFImporter_NodeElement_Color_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      if ((aiNode *)
          local_68.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (aiNode *)0x0) {
        operator_delete(local_68.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      p_Var2 = p_Var2->_M_next;
      this_01 = (aiNode *)
                local_68.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pObjectColor = pCVar3;
    } while (p_Var2 != local_38);
  }
  return;
}

Assistant:

void AMFImporter::Postprocess_BuildNodeAndObject(const CAMFImporter_NodeElement_Object& pNodeElement, std::list<aiMesh*>& pMeshList, aiNode** pSceneNode)
{
CAMFImporter_NodeElement_Color* object_color = nullptr;

	// create new aiNode and set name as <object> has.
	*pSceneNode = new aiNode;
	(*pSceneNode)->mName = pNodeElement.ID;
	// read mesh and color
	for(const CAMFImporter_NodeElement* ne_child: pNodeElement.Child)
	{
		std::vector<aiVector3D> vertex_arr;
		std::vector<CAMFImporter_NodeElement_Color*> color_arr;

		// color for object
		if(ne_child->Type == CAMFImporter_NodeElement::ENET_Color) object_color = (CAMFImporter_NodeElement_Color*)ne_child;

		if(ne_child->Type == CAMFImporter_NodeElement::ENET_Mesh)
		{
			// Create arrays from children of mesh: vertices.
			PostprocessHelper_CreateMeshDataArray(*((CAMFImporter_NodeElement_Mesh*)ne_child), vertex_arr, color_arr);
			// Use this arrays as a source when creating every aiMesh
			Postprocess_BuildMeshSet(*((CAMFImporter_NodeElement_Mesh*)ne_child), vertex_arr, color_arr, object_color, pMeshList, **pSceneNode);
		}
	}// for(const CAMFImporter_NodeElement* ne_child: pNodeElement)
}